

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_rtrim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  char *zString;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  jx9_value *pVal;
  long lVar6;
  bool bVar7;
  int nLen;
  int nListlen;
  int local_30;
  int local_2c;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
    return 0;
  }
  zString = jx9_value_to_string(*apArg,&local_30);
  lVar6 = (long)local_30;
  if (lVar6 < 1) {
LAB_00130682:
    pVal = pCtx->pRet;
    zString = "";
    local_30 = 0;
  }
  else {
    if (nArg == 1) {
      do {
        cVar1 = zString[lVar6 + -1];
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_001305f7;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      lVar6 = 0;
LAB_001305f7:
      pVal = pCtx->pRet;
      local_30 = (int)lVar6;
      goto LAB_0013068f;
    }
    pcVar3 = jx9_value_to_string(apArg[1],&local_2c);
    if (0 < (long)local_2c) {
      pcVar5 = zString + (long)local_30 + -1;
      do {
        pcVar4 = pcVar5;
        if (pcVar5 <= zString) break;
        lVar6 = 0;
        do {
          if (zString < pcVar4) {
            pcVar4 = pcVar4 + -(ulong)(*pcVar4 == pcVar3[lVar6]);
          }
          lVar6 = lVar6 + 1;
        } while (local_2c != lVar6);
        bVar7 = pcVar4 != pcVar5;
        pcVar5 = pcVar4;
      } while (bVar7);
      if (pcVar4 <= zString) goto LAB_00130682;
      local_30 = ((int)pcVar4 - (int)zString) + 1;
    }
    pVal = pCtx->pRet;
  }
LAB_0013068f:
  jx9_value_string(pVal,zString,local_30);
  return 0;
}

Assistant:

static int jx9Builtin_rtrim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL bytes*/
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringRightTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen - 1];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Right trim */
			for(;;){
				if( zEnd <= zCur ){
					break;
				}
				zPtr = zEnd;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zEnd > zCur && zEnd[0] == zList[i] ){
						zEnd--;
					}
				}
				if( zEnd == zPtr ){
					break;
				}
			}
			if( zEnd <= zCur ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				zEnd++;
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}